

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraImp.c
# Opt level: O0

void Fra_ImpAddToSolver(Fra_Man_t *p,Vec_Int_t *vImps,int *pSatVarNums)

{
  sat_solver *s;
  Aig_Man_t *pAVar1;
  ulong uVar2;
  ulong uVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  Aig_Obj_t *pObj;
  Aig_Obj_t *pObj_00;
  Aig_Obj_t *pAVar8;
  Aig_Obj_t *pAVar9;
  int fComplR;
  int fComplL;
  int status;
  int f;
  int i;
  int Right;
  int Left;
  int Imp;
  int pLits [2];
  Aig_Obj_t *pRightF;
  Aig_Obj_t *pLeftF;
  Aig_Obj_t *pRight;
  Aig_Obj_t *pLeft;
  sat_solver *pSat;
  int *pSatVarNums_local;
  Vec_Int_t *vImps_local;
  Fra_Man_t *p_local;
  
  s = p->pSat;
  status = 0;
  do {
    iVar4 = Vec_IntSize(vImps);
    if (iVar4 <= status) {
      iVar4 = sat_solver_simplify(s);
      if (iVar4 == 0) {
        sat_solver_delete(s);
        p->pSat = (sat_solver *)0x0;
      }
      Fra_ImpCompactArray(vImps);
      return;
    }
    iVar4 = Vec_IntEntry(vImps,status);
    pAVar1 = p->pManAig;
    iVar5 = Fra_ImpLeft(iVar4);
    pObj = Aig_ManObj(pAVar1,iVar5);
    pAVar1 = p->pManAig;
    iVar4 = Fra_ImpRight(iVar4);
    pObj_00 = Aig_ManObj(pAVar1,iVar4);
    for (fComplL = 0; fComplL < p->pPars->nFramesK; fComplL = fComplL + 1) {
      pAVar8 = Fra_ObjFraig(pObj,fComplL);
      pLits = (int  [2])Fra_ObjFraig(pObj_00,fComplL);
      pAVar8 = Aig_Regular(pAVar8);
      iVar4 = Aig_ObjIsNone(pAVar8);
      if (iVar4 != 0) {
LAB_00853a5f:
        Vec_IntWriteEntry(vImps,status,0);
        break;
      }
      pAVar8 = Aig_Regular((Aig_Obj_t *)pLits);
      iVar4 = Aig_ObjIsNone(pAVar8);
      if (iVar4 != 0) goto LAB_00853a5f;
    }
    if (p->pPars->nFramesK <= fComplL) {
      for (fComplL = 0; fComplL < p->pPars->nFramesK; fComplL = fComplL + 1) {
        pAVar8 = Fra_ObjFraig(pObj,fComplL);
        pLits = (int  [2])Fra_ObjFraig(pObj_00,fComplL);
        pAVar9 = Aig_Regular(pAVar8);
        iVar4 = pSatVarNums[pAVar9->Id];
        pAVar9 = Aig_Regular((Aig_Obj_t *)pLits);
        iVar5 = pSatVarNums[pAVar9->Id];
        if ((iVar4 < 1) || (p->nSatVars <= iVar4)) {
          __assert_fail("Left > 0 && Left < p->nSatVars",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/fra/fraImp.c"
                        ,0x1cf,"void Fra_ImpAddToSolver(Fra_Man_t *, Vec_Int_t *, int *)");
        }
        if ((iVar5 < 1) || (p->nSatVars <= iVar5)) {
          __assert_fail("Right > 0 && Right < p->nSatVars",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/fra/fraImp.c"
                        ,0x1d0,"void Fra_ImpAddToSolver(Fra_Man_t *, Vec_Int_t *, int *)");
        }
        uVar2 = *(ulong *)&pObj->field_0x18;
        uVar6 = Aig_IsComplement(pAVar8);
        uVar3 = *(ulong *)&pObj_00->field_0x18;
        uVar7 = Aig_IsComplement((Aig_Obj_t *)pLits);
        Left = iVar4 * 2 + (uint)((((uint)(uVar2 >> 3) & 1) != uVar6 ^ 0xffU) & 1);
        Imp = iVar5 * 2 + ((uint)(uVar3 >> 3) & 1 ^ uVar7);
        iVar4 = sat_solver_addclause(s,&Left,pLits);
        if (iVar4 == 0) {
          sat_solver_delete(s);
          p->pSat = (sat_solver *)0x0;
          return;
        }
      }
    }
    status = status + 1;
  } while( true );
}

Assistant:

void Fra_ImpAddToSolver( Fra_Man_t * p, Vec_Int_t * vImps, int * pSatVarNums )
{
    sat_solver * pSat = p->pSat;
    Aig_Obj_t * pLeft, * pRight;
    Aig_Obj_t * pLeftF, * pRightF;
    int pLits[2], Imp, Left, Right, i, f, status;
    int fComplL, fComplR;
    Vec_IntForEachEntry( vImps, Imp, i )
    {
        // get the corresponding nodes
        pLeft = Aig_ManObj( p->pManAig, Fra_ImpLeft(Imp) );
        pRight = Aig_ManObj( p->pManAig, Fra_ImpRight(Imp) );
        // check if all the nodes are present
        for ( f = 0; f < p->pPars->nFramesK; f++ )
        {
            // map these info fraig
            pLeftF = Fra_ObjFraig( pLeft, f );
            pRightF = Fra_ObjFraig( pRight, f );
            if ( Aig_ObjIsNone(Aig_Regular(pLeftF)) || Aig_ObjIsNone(Aig_Regular(pRightF)) )
            {
                Vec_IntWriteEntry( vImps, i, 0 );
                break;
            }
        } 
        if ( f < p->pPars->nFramesK )
            continue;
        // add constraints in each timeframe
        for ( f = 0; f < p->pPars->nFramesK; f++ )
        {
            // map these info fraig
            pLeftF = Fra_ObjFraig( pLeft, f );
            pRightF = Fra_ObjFraig( pRight, f );
            // get the corresponding SAT numbers
            Left = pSatVarNums[ Aig_Regular(pLeftF)->Id ];
            Right = pSatVarNums[ Aig_Regular(pRightF)->Id ];
            assert( Left > 0  && Left < p->nSatVars );
            assert( Right > 0 && Right < p->nSatVars );
            // get the complemented attributes
            fComplL = pLeft->fPhase ^ Aig_IsComplement(pLeftF);
            fComplR = pRight->fPhase ^ Aig_IsComplement(pRightF);
            // get the constraint
            // L => R      L' v R     (complement = L & R')
            pLits[0] = 2 * Left  + !fComplL;
            pLits[1] = 2 * Right +  fComplR;
            // add constraint to solver
            if ( !sat_solver_addclause( pSat, pLits, pLits + 2 ) )
            {
                sat_solver_delete( pSat );
                p->pSat = NULL;
                return;
            }
        }
    }
    status = sat_solver_simplify(pSat);
    if ( status == 0 )
    {
        sat_solver_delete( pSat );
        p->pSat = NULL;
    }
//    printf( "Total imps = %d. ", Vec_IntSize(vImps) );
    Fra_ImpCompactArray( vImps );
//    printf( "Valid imps = %d. \n", Vec_IntSize(vImps) );
}